

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miam-core.c
# Opt level: O2

void v1v2_alo_alr_format_text(la_vstring *vstr,void *data,int indent,la_miam_core_pdu_type pdu_type)

{
  char *pcVar1;
  
  if (pdu_type - LA_MIAM_CORE_PDU_UNKNOWN < 0xfffffffe) {
    return;
  }
  if (*(ushort *)((long)data + 8) != 0) {
    la_miam_errors_format_text(vstr,(uint)*(ushort *)((long)data + 8),indent);
    return;
  }
  la_vstring_append_sprintf
            (vstr,"%*sPDU Length: %u\n",(ulong)(uint)indent,"",(ulong)*(uint *)((long)data + 0xc));
  la_vstring_append_sprintf(vstr,"%*sAircraft ID: %s\n",(ulong)(uint)indent,"",(long)data + 0x14);
  pcVar1 = "comp_selected";
  if (pdu_type == LA_MIAM_CORE_PDU_ALO) {
    pcVar1 = "comp_supported";
  }
  la_vstring_append_sprintf(vstr,"%*sCompressions %s:\n",(ulong)(uint)indent,"",pcVar1 + 5);
  la_miam_bitmask_format_text
            (vstr,*(uint8_t *)((long)data + 0x1c),la_miam_core_v1v2_alo_alr_compression_names,
             indent + 1);
  la_vstring_append_sprintf(vstr,"%*sNetworks supported:\n",(ulong)(uint)indent,"");
  la_miam_bitmask_format_text
            (vstr,*(uint8_t *)((long)data + 0x1d),la_miam_core_v1v2_alo_alr_network_names,indent + 1
            );
  return;
}

Assistant:

static void v1v2_alo_alr_format_text(la_vstring *vstr, void const *data, int indent,
		la_miam_core_pdu_type pdu_type) {
	la_assert(vstr != NULL);
	la_assert(data != NULL);
	la_assert(indent >= 0);

	if(pdu_type != LA_MIAM_CORE_PDU_ALO && pdu_type != LA_MIAM_CORE_PDU_ALR) {
		return;
	}

	la_miam_core_v1v2_alo_alr_pdu const *pdu = data;
	if(pdu->err & LA_MIAM_ERR_HDR) {
		la_miam_errors_format_text(vstr, pdu->err & LA_MIAM_ERR_HDR, indent);
		return;
	}
	LA_ISPRINTF(vstr, indent, "PDU Length: %u\n", pdu->pdu_len);
	LA_ISPRINTF(vstr, indent, "Aircraft ID: %s\n", pdu->aircraft_id);
	LA_ISPRINTF(vstr, indent, "Compressions %s:\n",
			(pdu_type == LA_MIAM_CORE_PDU_ALO ? "supported" : "selected"));
	la_miam_bitmask_format_text(vstr, pdu->compression,
			la_miam_core_v1v2_alo_alr_compression_names, indent + 1);
	LA_ISPRINTF(vstr, indent, "Networks supported:\n");
	la_miam_bitmask_format_text(vstr, pdu->networks,
			la_miam_core_v1v2_alo_alr_network_names, indent + 1);
	// Not checking for body errors here, as there is no body in ALO and ALR PDUs
}